

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O2

void __thiscall HEkkDualRow::updateDual(HEkkDualRow *this,double theta)

{
  int iVar1;
  HEkk *pHVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer piVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  
  uVar7 = 0;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x49,0);
  pHVar2 = this->ekk_instance_;
  pdVar3 = (pHVar2->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (ulong)(uint)this->packCount;
  if (this->packCount < 1) {
    uVar6 = uVar7;
  }
  dVar8 = 0.0;
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    iVar1 = piVar5[uVar7];
    pdVar3[iVar1] = pdVar4[uVar7] * -theta + pdVar3[iVar1];
    dVar8 = dVar8 - pdVar4[uVar7] * theta *
                    (pHVar2->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar1] *
                    (double)(int)(pHVar2->basis_).nonbasicFlag_.
                                 super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start[iVar1] *
                    pHVar2->cost_scale_;
  }
  (pHVar2->info_).updated_dual_objective_value =
       dVar8 + (pHVar2->info_).updated_dual_objective_value;
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x49,0);
  return;
}

Assistant:

void HEkkDualRow::updateDual(double theta) {
  analysis->simplexTimerStart(UpdateDualClock);
  double* workDual = ekk_instance_.info_.workDual_.data();
  double dual_objective_value_change = 0;
  for (HighsInt i = 0; i < packCount; i++) {
    workDual[packIndex[i]] -= theta * packValue[i];
    // Identify the change to the dual objective
    HighsInt iCol = packIndex[i];
    const double delta_dual = theta * packValue[i];
    const double local_value = ekk_instance_.info_.workValue_[iCol];
    double local_dual_objective_change =
        ekk_instance_.basis_.nonbasicFlag_[iCol] * (-local_value * delta_dual);
    local_dual_objective_change *= ekk_instance_.cost_scale_;
    dual_objective_value_change += local_dual_objective_change;
  }
  ekk_instance_.info_.updated_dual_objective_value +=
      dual_objective_value_change;
  analysis->simplexTimerStop(UpdateDualClock);
}